

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeNF
          (ChElementShellANCF_3423 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  XprTypeNested pMVar7;
  scalar_constant_op<double> sVar8;
  scalar_constant_op<double> sVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  long index;
  uint i;
  long index_00;
  Scalar SVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double y;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChMatrix33<double> J_Cxi_Inv;
  ChVectorN<double,_3> M_scaled;
  Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> QiCompact;
  VectorN G_C;
  ChMatrix33<double> J_Cxi;
  VectorN G_B;
  MatrixNx3 Sxi_D;
  VectorN G_A;
  ShapeVector Ny;
  ShapeVector N;
  MatrixNx3 e_bar;
  ShapeVector Nz;
  ShapeVector Nx;
  double local_820;
  double local_818;
  double local_810;
  double local_808;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  undefined1 local_7d8 [16];
  XprTypeNested pMStack_7c8;
  variable_if_dynamic<long,__1> vStack_7c0;
  variable_if_dynamic<long,__1> vStack_7b8;
  Index IStack_7b0;
  scalar_constant_op<double> local_7a0;
  MapBase<Eigen::Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_>,_0> local_790;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_780;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_740;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_700;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_6c0;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_680 [8];
  PointerType local_678;
  XprTypeNested pMStack_670;
  XprTypeNested pMStack_668;
  long lStack_660;
  double dStack_658;
  XprTypeNested pMStack_650;
  undefined1 local_640 [16];
  XprTypeNested pMStack_630;
  variable_if_dynamic<long,__1> vStack_628;
  variable_if_dynamic<long,__1> vStack_620;
  Index IStack_618;
  Index IStack_610;
  Matrix<double,_3,_3,_1,_3,_3> local_608;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_5c0 [8];
  PointerType pdStack_5b8;
  double dStack_5b0;
  XprTypeNested local_5a8;
  long lStack_5a0;
  double dStack_598;
  XprTypeNested pMStack_590;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_580;
  undefined1 local_548 [24];
  scalar_constant_op<double> sStack_530;
  XprTypeNested local_528;
  variable_if_dynamic<long,__1> vStack_520;
  scalar_constant_op<double> sStack_518;
  XprTypeNested pMStack_510;
  double local_500;
  PointerType local_4f0;
  XprTypeNested pMStack_4e8;
  XprTypeNested pMStack_4e0;
  long lStack_4d8;
  Index IStack_4d0;
  Index IStack_4c8;
  double local_4b8;
  PointerType local_4a0;
  undefined8 uStack_498;
  XprTypeNested pMStack_490;
  long lStack_488;
  long lStack_480;
  Index IStack_478;
  double local_468;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
  local_450;
  undefined1 local_408 [16];
  XprTypeNested pMStack_3f8;
  variable_if_dynamic<long,__1> vStack_3f0;
  variable_if_dynamic<long,__1> vStack_3e8;
  XprTypeNested pMStack_3e0;
  scalar_constant_op<double> local_3d0;
  Matrix<double,_8,_3,_1,_8,_3> local_3c0;
  PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>> local_300 [64];
  ShapeVector local_2c0;
  ShapeVector local_280;
  PointerType local_240;
  PointerType pdStack_238;
  XprTypeNested pMStack_230;
  XprTypeNested pMStack_228;
  long lStack_220;
  double dStack_218;
  XprTypeNested pMStack_210;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_1f0;
  BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> local_1c0 [4];
  undefined8 local_100;
  double local_f8;
  undefined8 local_f0;
  double local_e8;
  undefined8 local_e0;
  double local_d8;
  undefined8 local_d0;
  double local_c8;
  MatrixBase<Eigen::Matrix<double,1,8,1,1,8>> local_c0 [144];
  
  ShapeFunctions(this,&local_280,U,V,W);
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase(&local_790,
          (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,8,3)
  ;
  index = 0;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_3c0,F,0,3);
  local_548._0_8_ = &local_280;
  vStack_520.m_value =
       (long)local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
             .array[4];
  sStack_518.m_other =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [5];
  pMStack_510 = (XprTypeNested)
                local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
                m_data.array[6];
  local_548._8_8_ =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [0];
  local_548._16_8_ =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [1];
  sStack_530.m_other =
       local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array
       [2];
  local_528 = (XprTypeNested)
              local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array[3];
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,8,3,1,8,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>>
            ((Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> *)&local_790,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
              *)local_548);
  y = V;
  ShapeFunctionsDerivativeX
            (this,(ShapeVector *)local_c0,
             local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
             .array[0],V,W);
  ShapeFunctionsDerivativeY(this,&local_2c0,U,y,W);
  local_100 = 0;
  local_c8 = (1.0 - U) * 0.25;
  local_d8 = (U + 1.0) * 0.25;
  local_f8 = local_c8 * (1.0 - V);
  local_e8 = local_d8 * (1.0 - V);
  local_d8 = local_d8 * (V + 1.0);
  local_c8 = local_c8 * (V + 1.0);
  local_f0 = 0;
  local_e0 = 0;
  local_d0 = 0;
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)&local_608,local_c0,&this->m_lenX);
  local_820._0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
               *)local_548,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
               *)&local_608,(int *)&local_820);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(local_1c0,&local_3c0,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
            ((Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false> *)local_1c0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)local_548);
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)&local_608,(MatrixBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_2c0,&this->m_lenY);
  local_820._0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
               *)local_548,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
               *)&local_608,(int *)&local_820);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(local_1c0,&local_3c0,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
            ((Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false> *)local_1c0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)local_548);
  Eigen::MatrixBase<Eigen::Matrix<double,1,8,1,1,8>>::operator*
            ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)&local_608,(MatrixBase<Eigen::Matrix<double,1,8,1,1,8>> *)&local_100,
             &this->m_thickness);
  local_820._0_4_ = 2;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
  ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
               *)local_548,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
               *)&local_608,(int *)&local_820);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(local_1c0,&local_3c0,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,8,1,1,8>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>>
            ((Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false> *)local_1c0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
              *)local_548);
  CalcCoordMatrix(this,(ChMatrixNM<double,_8,_3> *)local_1c0);
  local_548._0_8_ = local_1c0;
  local_548._8_8_ = &local_3c0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Matrix<double,8,3,1,8,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_608,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0>_>
              *)local_548);
  local_548._0_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_608;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_820,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)local_548);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true> *)
                  local_640,&local_3c0,0);
  lStack_220 = vStack_620.m_value;
  dStack_218 = (double)IStack_618;
  local_240 = (PointerType)local_640._0_8_;
  pdStack_238 = (PointerType)local_640._8_8_;
  pMStack_230 = pMStack_630;
  pMStack_228 = (XprTypeNested)vStack_628.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_408,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_240,&local_820);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_700,&local_3c0,1);
  local_6c0.m_startCol.m_value = local_700.m_startCol.m_value;
  local_6c0.m_outerStride = local_700.m_outerStride;
  local_6c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_6c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_6c0.m_xpr = local_700.m_xpr;
  local_6c0.m_startRow.m_value = local_700.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_7d8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_6c0,&local_808);
  sVar9.m_other = local_3d0.m_other;
  sVar8.m_other = local_7a0.m_other;
  dStack_598 = (double)vStack_3e8.m_value;
  pMStack_590 = pMStack_3e0;
  local_678 = (PointerType)local_7d8._0_8_;
  pMStack_670 = (XprTypeNested)local_7d8._8_8_;
  pdStack_5b8 = (PointerType)local_408._0_8_;
  dStack_5b0 = (double)local_408._8_8_;
  local_5a8 = pMStack_3f8;
  lStack_5a0 = vStack_3f0.m_value;
  pMStack_668 = pMStack_7c8;
  lStack_660 = vStack_7c0.m_value;
  dStack_658 = (double)vStack_7b8.m_value;
  pMStack_650 = (XprTypeNested)IStack_7b0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_780,&local_3c0,2);
  local_740.m_startCol.m_value = local_780.m_startCol.m_value;
  local_740.m_outerStride = local_780.m_outerStride;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_740.m_xpr = local_780.m_xpr;
  local_740.m_startRow.m_value = local_780.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*(&local_450,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_740,&local_7f0);
  sStack_518.m_other = dStack_598;
  pMStack_510 = pMStack_590;
  local_548._16_8_ = pdStack_5b8;
  sStack_530.m_other = dStack_5b0;
  local_528 = local_5a8;
  vStack_520.m_value = lStack_5a0;
  local_500 = sVar9.m_other;
  local_4f0 = local_678;
  pMStack_4e8 = pMStack_670;
  pMStack_4e0 = pMStack_668;
  lStack_4d8 = lStack_660;
  IStack_4d0 = (Index)dStack_658;
  IStack_4c8 = (Index)pMStack_650;
  local_4b8 = sVar8.m_other;
  local_4a0 = local_450.m_lhs.m_matrix.
              super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.
              m_data;
  uStack_498 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.
               _8_8_;
  pMStack_490 = local_450.m_lhs.m_matrix.
                super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.m_xpr
  ;
  lStack_488 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_startRow.m_value;
  lStack_480 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_startCol.m_value;
  IStack_478 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_outerStride;
  local_468 = local_450.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_300,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_548);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_6c0,&local_3c0,0);
  vStack_620.m_value = local_6c0.m_startCol.m_value;
  IStack_618 = local_6c0.m_outerStride;
  local_640._0_8_ =
       local_6c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_640._8_8_ =
       local_6c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  pMStack_630 = local_6c0.m_xpr;
  vStack_628.m_value = local_6c0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_408,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )local_640,&local_818);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_740,&local_3c0,1);
  local_700.m_startCol.m_value = local_740.m_startCol.m_value;
  local_700.m_outerStride = local_740.m_outerStride;
  local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_700.m_xpr = local_740.m_xpr;
  local_700.m_startRow.m_value = local_740.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_7d8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_700,&local_800);
  sVar9.m_other = local_3d0.m_other;
  sVar8.m_other = local_7a0.m_other;
  dStack_658 = (double)vStack_3e8.m_value;
  pMStack_650 = pMStack_3e0;
  pdStack_238 = (PointerType)local_7d8._0_8_;
  pMStack_230 = (XprTypeNested)local_7d8._8_8_;
  local_678 = (PointerType)local_408._0_8_;
  pMStack_670 = (XprTypeNested)local_408._8_8_;
  pMStack_668 = pMStack_3f8;
  lStack_660 = vStack_3f0.m_value;
  pMStack_228 = pMStack_7c8;
  lStack_220 = vStack_7c0.m_value;
  dStack_218 = (double)vStack_7b8.m_value;
  pMStack_210 = (XprTypeNested)IStack_7b0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_580,&local_3c0,2);
  local_780.m_startCol.m_value = local_580.m_startCol.m_value;
  local_780.m_outerStride = local_580.m_outerStride;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_580.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_580.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_780.m_xpr = local_580.m_xpr;
  local_780.m_startRow.m_value = local_580.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*(&local_450,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_780,&local_7e8);
  sStack_518.m_other = dStack_658;
  pMStack_510 = pMStack_650;
  local_548._16_8_ = local_678;
  sStack_530.m_other = (double)pMStack_670;
  local_528 = pMStack_668;
  vStack_520.m_value = lStack_660;
  local_500 = sVar9.m_other;
  local_4f0 = pdStack_238;
  pMStack_4e8 = pMStack_230;
  pMStack_4e0 = pMStack_228;
  lStack_4d8 = lStack_220;
  IStack_4d0 = (Index)dStack_218;
  IStack_4c8 = (Index)pMStack_210;
  local_4b8 = sVar8.m_other;
  local_4a0 = local_450.m_lhs.m_matrix.
              super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.
              m_data;
  uStack_498 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.
               _8_8_;
  pMStack_490 = local_450.m_lhs.m_matrix.
                super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.m_xpr
  ;
  lStack_488 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_startRow.m_value;
  lStack_480 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_startCol.m_value;
  IStack_478 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_outerStride;
  local_468 = local_450.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_5c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_548);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_700,&local_3c0,0);
  local_6c0.m_startCol.m_value = local_700.m_startCol.m_value;
  local_6c0.m_outerStride = local_700.m_outerStride;
  local_6c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_6c0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_700.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_6c0.m_xpr = local_700.m_xpr;
  local_6c0.m_startRow.m_value = local_700.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_408,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_6c0,&local_810);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_780,&local_3c0,1);
  local_740.m_startCol.m_value = local_780.m_startCol.m_value;
  local_740.m_outerStride = local_780.m_outerStride;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_740.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_780.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_740.m_xpr = local_780.m_xpr;
  local_740.m_startRow.m_value = local_780.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>
             *)local_7d8,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_740,&local_7f8);
  dStack_218 = (double)vStack_3e8.m_value;
  pMStack_210 = pMStack_3e0;
  local_640._8_8_ = local_7d8._0_8_;
  pMStack_630 = (XprTypeNested)local_7d8._8_8_;
  pdStack_238 = (PointerType)local_408._0_8_;
  pMStack_230 = (XprTypeNested)local_408._8_8_;
  pMStack_228 = pMStack_3f8;
  lStack_220 = vStack_3f0.m_value;
  vStack_628.m_value = (long)pMStack_7c8;
  vStack_620.m_value = vStack_7c0.m_value;
  IStack_618 = vStack_7b8.m_value;
  IStack_610 = IStack_7b0;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>::
  BlockImpl_dense(&local_1f0,&local_3c0,2);
  local_580.m_startCol.m_value = local_1f0.m_startCol.m_value;
  local_580.m_outerStride = local_1f0.m_outerStride;
  local_580.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       local_1f0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data;
  local_580.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_ =
       local_1f0.super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>._8_8_;
  local_580.m_xpr = local_1f0.m_xpr;
  local_580.m_startRow.m_value = local_1f0.m_startRow.m_value;
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>>::
  operator*(&local_450,
            (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>> *
            )&local_580,&local_7e0);
  sStack_518.m_other = dStack_218;
  pMStack_510 = pMStack_210;
  local_548._16_8_ = pdStack_238;
  sStack_530.m_other = (double)pMStack_230;
  local_528 = pMStack_228;
  vStack_520.m_value = lStack_220;
  local_500 = local_3d0.m_other;
  local_4f0 = (PointerType)local_640._8_8_;
  pMStack_4e8 = pMStack_630;
  pMStack_4e0 = (XprTypeNested)vStack_628.m_value;
  lStack_4d8 = vStack_620.m_value;
  IStack_4d0 = IStack_618;
  IStack_4c8 = IStack_610;
  local_4b8 = local_7a0.m_other;
  local_4a0 = local_450.m_lhs.m_matrix.
              super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.
              m_data;
  uStack_498 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
               super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.
               _8_8_;
  pMStack_490 = local_450.m_lhs.m_matrix.
                super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.m_xpr
  ;
  lStack_488 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_startRow.m_value;
  lStack_480 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_startCol.m_value;
  IStack_478 = local_450.m_lhs.m_matrix.
               super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
               super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
               m_outerStride;
  local_468 = local_450.m_rhs.m_functor.m_other;
  Eigen::PlainObjectBase<Eigen::Matrix<double,8,1,0,8,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,8,3,1,8,3>,8,1,false>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,8,1,1,8>const>const>const>>
            (local_680,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_8,_1,_1,_8>_>_>_>_>
              *)local_548);
  local_450.m_lhs.m_matrix.
  super_BlockImpl<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_8,_1,_false>,_0>.m_data =
       (PointerType)0x3fe0000000000000;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_408,F,3,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)local_548,(double *)&local_450,(StorageBaseType *)local_408);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_7d8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
              *)local_548);
  for (index_00 = 0; uVar5 = local_7d8._8_8_, index_00 != 8; index_00 = index_00 + 1) {
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_680,
                         index_00);
    pMVar7 = pMStack_7c8;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_5c0,
                         index_00);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar5;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (double)pMVar7 * *pSVar10;
    auVar2 = vfmsub231sd_fma(auVar16,auVar13,auVar2);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index);
    pMVar7 = pMStack_7c8;
    *pSVar11 = auVar2._0_8_ + *pSVar11;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_300,
                         index_00);
    uVar5 = local_7d8._0_8_;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_680,
                         index_00);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = pMVar7;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (double)uVar5 * *pSVar10;
    auVar2 = vfmsub231sd_fma(auVar17,auVar14,auVar3);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 1)
    ;
    uVar5 = local_7d8._0_8_;
    *pSVar11 = auVar2._0_8_ + *pSVar11;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_5c0,
                         index_00);
    uVar6 = local_7d8._8_8_;
    SVar1 = *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>,_1> *)local_300,
                         index_00);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar5;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (double)uVar6 * *pSVar10;
    auVar2 = vfmsub231sd_fma(auVar18,auVar15,auVar4);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,index + 2)
    ;
    index = index + 3;
    *pSVar11 = auVar2._0_8_ + *pSVar11;
  }
  SVar12 = Eigen::internal::determinant_impl<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_3>::run
                     (&local_608);
  *detJ = SVar12;
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, W);

    Eigen::Map<MatrixNx3> QiCompact(Qi.data(), NSF, 3);
    QiCompact = N.transpose() * F.segment(0, 3).transpose();

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, U, V, W);
    ShapeFunctionsDerivativeY(Ny, U, V, W);
    ShapeFunctionsDerivativeZ(Nz, U, V, W);

    // Change the shape function derivatives with respect to the element local "x", "y", or "z" coordinates to be with
    // respect to the normalized coordinates "xi", "eta", and "zeta" when loading the results into the Sxi_D matrix
    MatrixNx3 Sxi_D;
    Sxi_D.col(0) = Nx * m_lenX / 2;
    Sxi_D.col(1) = Ny * m_lenY / 2;
    Sxi_D.col(2) = Nz * m_thickness / 2;

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the element Jacobian between the current configuration and the normalized configuration
    ChMatrix33<double> J_Cxi = e_bar.transpose() * Sxi_D;
    ChMatrix33<double> J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i + 0) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi(3 * i + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi(3 * i + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}